

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManNodeIfToGia_rec
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited,int fHash)

{
  int iVar1;
  int iVar2;
  If_Cut_t *pCut_00;
  int iFunc1;
  int iFunc0;
  int iFunc;
  If_Obj_t *pTemp;
  If_Cut_t *pCut;
  int fHash_local;
  Vec_Ptr_t *vVisited_local;
  If_Obj_t *pIfObj_local;
  If_Man_t *pIfMan_local;
  Gia_Man_t *pNew_local;
  
  pCut_00 = If_ObjCutBest(pIfObj);
  iVar1 = If_CutDataInt(pCut_00);
  if (iVar1 == 0) {
    Vec_PtrPush(vVisited,pCut_00);
    If_CutSetDataInt(pCut_00,-1);
    iVar1 = If_ObjIsCi(pIfObj);
    _iFunc0 = pIfObj;
    if (iVar1 == 0) {
      for (; _iFunc0 != (If_Obj_t *)0x0; _iFunc0 = _iFunc0->pEquiv) {
        iVar1 = Gia_ManNodeIfToGia_rec(pNew,pIfMan,_iFunc0->pFanin0,vVisited,fHash);
        if ((iVar1 != -1) &&
           (iVar2 = Gia_ManNodeIfToGia_rec(pNew,pIfMan,_iFunc0->pFanin1,vVisited,fHash), iVar2 != -1
           )) {
          if (fHash == 0) {
            iVar1 = Abc_LitNotCond(iVar1,*(uint *)_iFunc0 >> 4 & 1);
            iVar2 = Abc_LitNotCond(iVar2,*(uint *)_iFunc0 >> 5 & 1);
            iFunc1 = Gia_ManAppendAnd(pNew,iVar1,iVar2);
          }
          else {
            iVar1 = Abc_LitNotCond(iVar1,*(uint *)_iFunc0 >> 4 & 1);
            iVar2 = Abc_LitNotCond(iVar2,*(uint *)_iFunc0 >> 5 & 1);
            iFunc1 = Gia_ManHashAnd(pNew,iVar1,iVar2);
          }
          if ((*(uint *)_iFunc0 >> 6 & 1) != (*(uint *)pIfObj >> 6 & 1)) {
            iFunc1 = Abc_LitNot(iFunc1);
          }
          If_CutSetDataInt(pCut_00,iFunc1);
          break;
        }
      }
      pNew_local._4_4_ = If_CutDataInt(pCut_00);
    }
    else {
      pNew_local._4_4_ = If_CutDataInt(pCut_00);
    }
  }
  else {
    pNew_local._4_4_ = If_CutDataInt(pCut_00);
  }
  return pNew_local._4_4_;
}

Assistant:

int Gia_ManNodeIfToGia_rec( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited, int fHash )
{
    If_Cut_t * pCut;
    If_Obj_t * pTemp;
    int iFunc, iFunc0, iFunc1;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutDataInt(pCut) )
        return If_CutDataInt(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return If_CutDataInt(pCut);
    // compute the functions of the children
    for ( pTemp = pIfObj; pTemp; pTemp = pTemp->pEquiv )
    {
        iFunc0 = Gia_ManNodeIfToGia_rec( pNew, pIfMan, pTemp->pFanin0, vVisited, fHash );
        if ( iFunc0 == ~0 )
            continue;
        iFunc1 = Gia_ManNodeIfToGia_rec( pNew, pIfMan, pTemp->pFanin1, vVisited, fHash );
        if ( iFunc1 == ~0 )
            continue;
        // both branches are solved
        if ( fHash )
            iFunc = Gia_ManHashAnd( pNew, Abc_LitNotCond(iFunc0, pTemp->fCompl0), Abc_LitNotCond(iFunc1, pTemp->fCompl1) ); 
        else
            iFunc = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iFunc0, pTemp->fCompl0), Abc_LitNotCond(iFunc1, pTemp->fCompl1) ); 
        if ( pTemp->fPhase != pIfObj->fPhase )
            iFunc = Abc_LitNot(iFunc);
        If_CutSetDataInt( pCut, iFunc );
        break;
    }
    return If_CutDataInt(pCut);
}